

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::SingleVertexArrayOutputTypeTests::init
          (SingleVertexArrayOutputTypeTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  OutputType outputType_;
  GLValue min_;
  GLValue max_;
  MultiVertexArrayTest *this_00;
  long lVar1;
  long lVar2;
  int componentCount_;
  long lVar3;
  GLValue GVar4;
  GLValue GVar5;
  undefined4 uStack_d4;
  undefined4 uStack_c4;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    type = (&DAT_005bd4b0)[lVar1];
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      outputType_ = (&DAT_005bd4c8)[lVar2];
      for (componentCount_ = 2; componentCount_ != 5; componentCount_ = componentCount_ + 1) {
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
          GVar4 = deqp::gls::GLValue::getMinValue(type);
          GVar5 = deqp::gls::GLValue::getMaxValue(type);
          max_._4_4_ = uStack_d4;
          max_.type = GVar5.type;
          min_._4_4_ = uStack_c4;
          min_.type = GVar4.type;
          min_.field_1 = GVar4.field_1;
          max_.field_1 = GVar5.field_1;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    (&arraySpec,type,outputType_,STORAGE_USER,USAGE_DYNAMIC_DRAW,componentCount_,0,0
                     ,false,min_,max_);
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          spec.primitive = PRIMITIVE_TRIANGLES;
          spec.drawCount = *(int *)((long)&DAT_005bd478 + lVar3);
          spec.first = 0;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::push_back(&spec.arrays,&arraySpec);
          deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(&name,&spec);
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,&spec,
                     name._M_dataplus._M_p,name._M_dataplus._M_p);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          std::__cxx11::string::~string((string *)&name);
          std::
          _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::~_Vector_base(&spec.arrays.
                           super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                         );
        }
      }
    }
  }
  return 6;
}

Assistant:

void SingleVertexArrayOutputTypeTests::init (void)
{
	// Test output types with different input types, component counts and storage, Usage?, Precision?, float?
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_UNSIGNED_SHORT, Array::INPUTTYPE_UNSIGNED_BYTE, Array::INPUTTYPE_FIXED};
	Array::OutputType	outputTypes[]	= {Array::OUTPUTTYPE_VEC2, Array::OUTPUTTYPE_VEC3, Array::OUTPUTTYPE_VEC4};
	Array::Storage		storages[]		= {Array::STORAGE_USER};
	int					counts[]		= {1, 256};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int outputTypeNdx = 0; outputTypeNdx < DE_LENGTH_OF_ARRAY(outputTypes); outputTypeNdx++)
		{
			for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
			{
				for (int componentCount = 2; componentCount < 5; componentCount++)
				{
					for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
					{
						MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																		outputTypes[outputTypeNdx],
																		storages[storageNdx],
																		Array::USAGE_DYNAMIC_DRAW,
																		componentCount,
																		0,
																		0,
																		false,
																		GLValue::getMinValue(inputTypes[inputTypeNdx]),
																		GLValue::getMaxValue(inputTypes[inputTypeNdx]));

						MultiVertexArrayTest::Spec spec;
						spec.primitive	= Array::PRIMITIVE_TRIANGLES;
						spec.drawCount	= counts[countNdx];
						spec.first		= 0;
						spec.arrays.push_back(arraySpec);

						std::string name = spec.getName();
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
					}
				}
			}
		}
	}
}